

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall olc::Renderer_OGL10::DestroyDevice(Renderer_OGL10 *this)

{
  Renderer_OGL10 *this_local;
  
  glXMakeCurrent(this->olc_Display,0);
  glXDestroyContext(this->olc_Display,this->glDeviceContext);
  return OK;
}

Assistant:

olc::rcode DestroyDevice() override
		{
#if defined(_WIN32)
			wglDeleteContext(glRenderContext);
#endif

#if defined(__linux__) || defined(__FreeBSD__)
			glXMakeCurrent(olc_Display, None, NULL);
			glXDestroyContext(olc_Display, glDeviceContext);
#endif

#if defined(__APPLE__)
			glutDestroyWindow(glutGetWindow());
#endif
			return olc::rcode::OK;
		}